

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O1

method_info * __thiscall
Frame::getMethodNamed(Frame *this,ClassRuntime *classRuntime,string *name,string *descriptor)

{
  method_info *pmVar1;
  bool bVar2;
  int iVar3;
  ClassFile *pCVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  string methodName;
  string methodDesc;
  allocator local_a1;
  method_info *local_a0;
  ClassRuntime *local_98;
  string *local_90;
  string *local_88;
  string local_80;
  MethodArea *local_60;
  Frame *local_58;
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  local_90 = descriptor;
  local_88 = name;
  local_58 = this;
  local_60 = MethodArea::getInstance();
  do {
    if (classRuntime == (ClassRuntime *)0x0) {
      return (method_info *)0x0;
    }
    local_98 = classRuntime;
    pCVar4 = ClassRuntime::getClassFile(classRuntime);
    bVar8 = pCVar4->methods_count != 0;
    if (bVar8) {
      lVar6 = 0;
      uVar7 = 0;
      do {
        pmVar1 = pCVar4->methods;
        pcVar5 = getFormattedConstant
                           (pCVar4->constant_pool,*(u2 *)((long)&pmVar1->name_index + lVar6));
        std::__cxx11::string::string((string *)&local_80,pcVar5,(allocator *)&local_50);
        pcVar5 = getFormattedConstant
                           (pCVar4->constant_pool,*(u2 *)((long)&pmVar1->descriptor_index + lVar6));
        std::__cxx11::string::string((string *)&local_50,pcVar5,&local_a1);
        bVar2 = true;
        if (((local_80._M_string_length == local_88->_M_string_length) &&
            (((local_80._M_string_length == 0 ||
              (iVar3 = bcmp(local_80._M_dataplus._M_p,(local_88->_M_dataplus)._M_p,
                            local_80._M_string_length), iVar3 == 0)) &&
             (local_48 == local_90->_M_string_length)))) &&
           ((local_48 == 0 ||
            (iVar3 = bcmp(local_50,(local_90->_M_dataplus)._M_p,local_48), iVar3 == 0)))) {
          local_a0 = (method_info *)((long)&pmVar1->access_flags + lVar6);
          local_58->_classRuntime = local_98;
          bVar2 = false;
        }
        if (local_50 != local_40) {
          operator_delete(local_50);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p);
        }
        if (!bVar2) break;
        uVar7 = uVar7 + 1;
        lVar6 = lVar6 + 0x10;
        bVar8 = uVar7 < pCVar4->methods_count;
      } while (bVar8);
    }
    classRuntime = local_98;
    if (!bVar8) {
      if (pCVar4->super_class == 0) {
        classRuntime = (ClassRuntime *)0x0;
      }
      else {
        pcVar5 = getFormattedConstant(pCVar4->constant_pool,pCVar4->super_class);
        std::__cxx11::string::string((string *)&local_80,pcVar5,(allocator *)&local_50);
        classRuntime = MethodArea::loadClassNamed(local_60,&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p);
        }
      }
    }
    if (bVar8) {
      return local_a0;
    }
  } while( true );
}

Assistant:

method_info* Frame::getMethodNamed(ClassRuntime *classRuntime, string name, string descriptor) {
    MethodArea &methodArea = MethodArea::getInstance();
    
    ClassRuntime *currClass = classRuntime;
    method_info *method;
    
    while (currClass != NULL) {
        ClassFile *classFile = currClass->getClassFile();
        
        for (int i = 0; i < classFile->methods_count; i++) {
            method = &(classFile->methods[i]);
            string methodName = getFormattedConstant(classFile->constant_pool, method->name_index);
            string methodDesc = getFormattedConstant(classFile->constant_pool, method->descriptor_index);
            
            if (methodName == name && methodDesc == descriptor) {
                _classRuntime = currClass;
                return method;
            }
        }
        
        // procurando o método nas super classes.
        if (classFile->super_class == 0) {
            currClass = NULL;
        } else {
            string superClassName = getFormattedConstant(classFile->constant_pool, classFile->super_class);
            currClass = methodArea.loadClassNamed(superClassName);
        }
    }
    
    return NULL;
}